

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O3

void __thiscall r_code::Atom::trace(Atom *this)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  uint8_t i;
  long lVar5;
  bool bVar6;
  string s;
  char *local_48;
  undefined8 local_40;
  char local_38 [16];
  
  if (Members_to_go != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
    Members_to_go = Members_to_go + -1;
  }
  switch(this->atom >> 0x18) {
  case 0x80:
    pcVar3 = "nil";
    goto LAB_0010614e;
  case 0x81:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bl: ",4);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) | 1;
    std::ostream::_M_insert<bool>(true);
    return;
  case 0x82:
    pcVar3 = ":";
    lVar5 = 1;
    break;
  case 0x83:
    pcVar3 = "::";
    lVar5 = 2;
    break;
  case 0x84:
    pcVar3 = "iptr: ";
    goto LAB_00106067;
  case 0x85:
    pcVar3 = "rptr: ";
LAB_00106067:
    lVar5 = 6;
    goto LAB_00106081;
  case 0x86:
    pcVar3 = "vlptr: ";
    lVar5 = 7;
    goto LAB_00106081;
  case 0x87:
    pcVar3 = "ipgm_ptr: ";
    goto LAB_00106012;
  case 0x88:
    pcVar3 = "in_obj_ptr: ";
    lVar5 = 0xc;
    goto LAB_001060b5;
  case 0x89:
    pcVar3 = "value_ptr: ";
    lVar5 = 0xb;
    goto LAB_00106081;
  case 0x8a:
    pcVar3 = "prod_ptr: ";
LAB_00106012:
    lVar5 = 10;
    goto LAB_00106081;
  case 0x8b:
    pcVar3 = "out_obj_ptr: ";
    lVar5 = 0xd;
LAB_00106081:
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
LAB_00106106:
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    return;
  case 0x8c:
    pcVar3 = "d_in_obj_ptr: ";
    lVar5 = 0xe;
LAB_001060b5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
LAB_001060dc:
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    goto LAB_00106106;
  case 0x8d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"assign_ptr: ",0xc);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    goto LAB_001060dc;
  default:
    if (Timestamp_data != '\0') {
      Timestamp_data = Timestamp_data + -1;
      poVar4 = (ostream *)&std::cout;
      goto LAB_00106106;
    }
    if (String_data != '\0') {
      String_data = String_data + -1;
      local_40 = 0;
      local_38[0] = '\0';
      lVar5 = 0;
      local_48 = local_38;
      do {
        bVar6 = Char_count == '\0';
        Char_count = Char_count + -1;
        if (bVar6) break;
        std::__cxx11::string::push_back((char)&local_48);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      std::operator<<((ostream *)&std::cout,local_48);
      if (local_48 == local_38) {
        return;
      }
      operator_delete(local_48);
      return;
    }
    if (-1 < (int)this->atom) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb: ",4);
      *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
           *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::ostream::_M_insert<double>((double)(float)(this->atom * 2));
      return;
    }
    pcVar3 = "undef";
    lVar5 = 5;
    break;
  case 0x90:
    pcVar3 = "this";
    goto LAB_00106037;
  case 0x91:
    pcVar3 = "view";
LAB_00106037:
    lVar5 = 4;
    break;
  case 0x92:
    pcVar3 = "mks";
    goto LAB_0010614e;
  case 0x93:
    pcVar3 = "vws";
LAB_0010614e:
    lVar5 = 3;
    break;
  case 0xa0:
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nid: ",5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    goto LAB_00106106;
  case 0xa1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"did: ",5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    goto LAB_00106106;
  case 0xa2:
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fid: ",5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    goto LAB_00106106;
  case 0xc0:
    pcVar3 = "cptr: ";
    lVar5 = 6;
    goto LAB_00105e42;
  case 0xc1:
    pcVar3 = "set: ";
    lVar5 = 5;
LAB_00105e42:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar4 = (ostream *)&std::cout;
    goto LAB_001062bf;
  case 0xc2:
    pcVar3 = "s_set: ";
    lVar5 = 7;
    goto LAB_0010624e;
  case 0xc3:
    pcVar3 = "obj: ";
    goto LAB_00106136;
  case 0xc4:
    pcVar3 = "mk: ";
    goto LAB_00106249;
  case 0xc5:
    pcVar3 = "op: ";
LAB_00106249:
    lVar5 = 4;
    goto LAB_0010624e;
  case 0xc6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"st: ",4);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    uVar1 = this->atom;
    uVar2 = (uVar1 >> 0x18) - 0xc0;
    Char_count = (char)uVar1;
    if (0xe < uVar2) {
      Members_to_go = 0;
      String_data = 0;
      return;
    }
    if ((0x7f3fU >> (uVar2 & 0x1f) & 1) != 0) {
      Members_to_go = Char_count;
      String_data = Char_count;
      return;
    }
    if (uVar2 != 6) {
      Members_to_go = 2;
      String_data = 2;
      return;
    }
    Members_to_go = (char)(uVar1 >> 8);
    String_data = Members_to_go;
    return;
  case 199:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"us",2);
    Members_to_go = 2;
    Timestamp_data = 2;
    return;
  case 200:
    pcVar3 = "grp: ";
    goto LAB_00106136;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    pcVar3 = "ipgm: ";
    lVar5 = 6;
    goto LAB_0010624e;
  case 0xcd:
    pcVar3 = "cst: ";
    goto LAB_00106136;
  case 0xce:
    pcVar3 = "mdl: ";
LAB_00106136:
    lVar5 = 5;
LAB_0010624e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
LAB_001062bf:
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    uVar1 = this->atom;
    uVar2 = (uVar1 >> 0x18) - 0xc0;
    if (uVar2 < 0xf) {
      if ((0x7f3fU >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 6) {
          Members_to_go = 2;
          return;
        }
        uVar1 = uVar1 >> 8;
      }
      Members_to_go = (char)uVar1;
    }
    else {
      Members_to_go = 0;
    }
    return;
  case 0xcf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"null pgm ",9);
    pcVar3 = "all inputs";
    if ((this->atom & 1) == 0) {
      pcVar3 = "new inputs";
    }
    lVar5 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
  return;
}

Assistant:

void Atom::trace() const
{
    write_indents();

    switch (getDescriptor()) {
    case NIL:
        std::cout << "nil";
        return;

    case BOOLEAN_:
        std::cout << "bl: " << std::boolalpha << asBoolean();
        return;

    case WILDCARD:
        std::cout << ":";
        return;

    case T_WILDCARD:
        std::cout << "::";
        return;

    case I_PTR:
        std::cout << "iptr: " << std::dec << asIndex();
        return;

    case VL_PTR:
        std::cout << "vlptr: " << std::dec << asIndex();
        return;

    case R_PTR:
        std::cout << "rptr: " << std::dec << asIndex();
        return;

    case IPGM_PTR:
        std::cout << "ipgm_ptr: " << std::dec << asIndex();
        return;

    case IN_OBJ_PTR:
        std::cout << "in_obj_ptr: " << std::dec << (uint32_t)asInputIndex() << " " << asIndex();
        return;

    case D_IN_OBJ_PTR:
        std::cout << "d_in_obj_ptr: " << std::dec << (uint32_t)asRelativeIndex() << " " << asIndex();
        return;

    case OUT_OBJ_PTR:
        std::cout << "out_obj_ptr: " << std::dec << asIndex();
        return;

    case VALUE_PTR:
        std::cout << "value_ptr: " << std::dec << asIndex();
        return;

    case PROD_PTR:
        std::cout << "prod_ptr: " << std::dec << asIndex();
        return;

    case ASSIGN_PTR:
        std::cout << "assign_ptr: " << std::dec << (uint16_t)asAssignmentIndex() << " " << asIndex();
        return;

    case THIS:
        std::cout << "this";
        return;

    case VIEW:
        std::cout << "view";
        return;

    case MKS:
        std::cout << "mks";
        return;

    case VWS:
        std::cout << "vws";
        return;

    case NODE:
        std::cout << "nid: " << std::dec << (uint32_t)getNodeID();
        return;

    case DEVICE:
        std::cout << "did: " << std::dec << (uint32_t)getNodeID() << " " << (uint32_t)getClassID() << " " << (uint32_t)getDeviceID();
        return;

    case DEVICE_FUNCTION:
        std::cout << "fid: " << std::dec << asOpcode();
        return;

    case C_PTR:
        std::cout << "cptr: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case SET:
        std::cout << "set: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OBJECT:
        std::cout << "obj: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case S_SET:
        std::cout << "s_set: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MARKER:
        std::cout << "mk: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OPERATOR:
        std::cout << "op: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case STRING:
        std::cout << "st: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = String_data = getAtomCount();
        Char_count = (atom & 0x000000FF);
        return;

    case TIMESTAMP:
        std::cout << "us";
        Members_to_go = Timestamp_data = 2;
        return;

    case GROUP:
        std::cout << "grp: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case INSTANTIATED_PROGRAM:
    case INSTANTIATED_ANTI_PROGRAM:
    case INSTANTIATED_INPUT_LESS_PROGRAM:
        std::cout << "ipgm: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case COMPOSITE_STATE:
        std::cout << "cst: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MODEL:
        std::cout << "mdl: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case NULL_PROGRAM:
        std::cout << "null pgm " << (takesPastInputs() ? "all inputs" : "new inputs");
        return;

    default:
        if (Timestamp_data) {
            --Timestamp_data;
            std::cout << atom;
        } else if (String_data) {
            --String_data;
            std::string s;
            char *content = (char *)&atom;

            for (uint8_t i = 0; i < 4; ++i) {
                if (Char_count-- > 0) {
                    s += content[i];
                } else {
                    break;
                }
            }

            std::cout << s.c_str();
        } else if (isFloat()) {
            std::cout << "nb: " << std::dec << asFloat();
            return;
        } else {
            std::cout << "undef";
        }

        return;
    }
}